

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_block.cpp
# Opt level: O1

uint32_t __thiscall cppnet::BufferBlock::_Write(BufferBlock *this,char *data,uint32_t len)

{
  char *pcVar1;
  char *__dest;
  ulong uVar2;
  ulong __n;
  ulong uVar3;
  size_t sVar4;
  
  pcVar1 = this->_read;
  __dest = this->_write;
  if (__dest < pcVar1) {
    uVar3 = (long)pcVar1 - (long)__dest;
    uVar2 = (ulong)len;
    if (uVar3 < uVar2) {
      memcpy(__dest,data,uVar3);
      this->_write = this->_write + uVar3;
      this->_can_read = true;
      uVar3 = uVar3 & 0xffffffff;
      goto LAB_00116440;
    }
    memcpy(__dest,data,uVar2);
    pcVar1 = this->_write;
    this->_write = pcVar1 + uVar2;
    if (pcVar1 + uVar2 == this->_read) {
      this->_can_read = true;
    }
  }
  else {
    if ((__dest == pcVar1) && (uVar3 = 0, this->_can_read != false)) goto LAB_00116440;
    sVar4 = (long)pcVar1 - (long)this->_buffer_start;
    __n = (long)this->_buffer_end - (long)__dest;
    uVar3 = sVar4 + __n;
    uVar2 = (ulong)len;
    if (uVar3 <= uVar2) {
      memcpy(__dest,data,__n);
      memcpy(this->_buffer_start,data + __n,sVar4);
      this->_write = this->_read;
      this->_can_read = true;
      goto LAB_00116440;
    }
    sVar4 = uVar2 - __n;
    if (uVar2 < __n || sVar4 == 0) {
      memcpy(__dest,data,uVar2);
      this->_write = this->_write + uVar2;
    }
    else {
      memcpy(__dest,data,__n);
      memcpy(this->_buffer_start,data + __n,sVar4);
      this->_write = this->_buffer_start + sVar4;
    }
  }
  uVar3 = (ulong)len;
LAB_00116440:
  return (uint32_t)uVar3;
}

Assistant:

uint32_t BufferBlock::_Write(const char* data, uint32_t len) {
    /*s-----------w-----r-------------e*/
    if (_write < _read) {
        size_t size = _read - _write;
        // can save all data
        if (len <= size) {
            memcpy(_write, data, len);
            _write += len;
            if (_write == _read) {
                _can_read = true;
            }
            return len;

        // can save a part of data
        } else {
            memcpy(_write, data, size);
            _write += size;
            _can_read = true;

            return (uint32_t)size;
        }
    
    /*s-----------r-----w-------------e*/
    /*s-----------rw------------------e*/
    } else {
        if(_can_read && _read == _write) {
            return 0;
        }

        size_t size_start = _read - _buffer_start;
        size_t size_end = _buffer_end - _write;
        size_t size =  size_start + size_end;

        // all buffer will be used
        if (size <= len) {
            memcpy(_write, data, size_end);
            memcpy(_buffer_start, data + size_end, size_start);

            _write = _read;
            _can_read = true;
            return (int32_t)size;

        // part of buffer will be used
        } else {
            if (len <= size_end) {
                memcpy(_write, data, len);
                _write += len;
                return len;

            } else {
                size_t left = len - size_end;

                memcpy(_write, data, size_end);
                memcpy(_buffer_start, data + size_end, left);
               
                _write = _buffer_start + left;
                return len;
            }
        }
    }
}